

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  buffer<char> *this;
  size_t sVar4;
  char cVar5;
  uint uVar6;
  result rVar7;
  decimal_fp<float> dVar8;
  byte bVar9;
  long lVar10;
  size_t count;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint64_t error;
  size_t __len;
  ulong uVar14;
  uint64_t uVar15;
  ulong uVar16;
  fp fVar17;
  fp fVar18;
  decimal_fp<double> dVar19;
  ulong uStackY_a0;
  int local_88;
  int cached_exp10;
  uint64_t local_80;
  float local_74;
  buffer<char> *local_70;
  fixed_handler handler;
  
  uVar11 = (ulong)specs & 0xff00000000;
  if (value <= (longdouble)0) {
    if (precision < 1 || uVar11 != 0x200000000) {
      handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
      buffer<char>::push_back(buf,(char *)&handler);
      local_88 = 0;
    }
    else {
      buffer<char>::try_resize(buf,(ulong)(uint)precision);
      memset(buf->ptr_,0x30,(ulong)(uint)precision);
      local_88 = -precision;
    }
  }
  else {
    uVar6 = specs._4_4_;
    if ((uVar6 >> 0x13 & 1) == 0) {
      local_88 = snprintf_float<long_double>(value,precision,specs,buf);
    }
    else if (precision < 0) {
      if ((uVar6 >> 0x12 & 1) == 0) {
        dVar19 = dragonbox::to_decimal<double>((double)value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>
                  ((buffer_appender<char>)buf,dVar19.significand);
        local_88 = dVar19.exponent;
      }
      else {
        local_74 = (float)value;
        dVar8 = dragonbox::to_decimal<float>(local_74);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                  ((buffer_appender<char>)buf,dVar8.significand);
        local_88 = dVar8.exponent;
      }
    }
    else {
      cached_exp10 = 0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = buf;
      fVar17 = normalize<0>((detail *)0x0,(fp)(auVar3 << 0x40));
      local_70 = buf;
      fVar18 = get_cached_power(-0x7c - fVar17.e,&cached_exp10);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = fVar18.f;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = fVar17.f;
      uVar14 = SUB168(auVar1 * auVar2,8) - (SUB168(auVar1 * auVar2,0) >> 0x3f);
      iVar13 = fVar18.e + fVar17.e;
      handler.precision = 0x2ff;
      if ((uint)precision < 0x2ff) {
        handler.precision = precision;
      }
      handler.buf = local_70->ptr_;
      handler.size = 0;
      handler.exp10 = -cached_exp10;
      local_80 = CONCAT44(local_80._4_4_,iVar13);
      bVar9 = -(char)iVar13;
      uVar15 = 1L << (bVar9 & 0x3f);
      uVar12 = uVar14 >> (bVar9 & 0x3f);
      handler.fixed = uVar11 == 0x200000000;
      local_88 = count_digits((uint32_t)uVar12);
      rVar7 = fixed_handler::on_start
                        (&handler,*(long *)(basic_data<void>::grisu_pow10_exponents +
                                           (long)local_88 * 8 + 0xa8) << (bVar9 & 0x3f),uVar14 / 10,
                         10,&local_88);
      if (rVar7 == more) {
        bVar9 = -(char)local_80 - 0x40;
        uVar16 = uVar15 - 1;
        uVar14 = uVar14 & uVar16;
        error = 1;
        local_80 = uVar15;
        do {
          iVar13 = local_88 + -1;
          switch(iVar13) {
          case 0:
            cVar5 = (char)uVar12;
            uVar12 = 0;
            goto LAB_001392aa;
          case 1:
            uStackY_a0 = 10;
            break;
          case 2:
            uStackY_a0 = 100;
            break;
          case 3:
            uStackY_a0 = 1000;
            break;
          case 4:
            uStackY_a0 = 10000;
            break;
          case 5:
            uStackY_a0 = 100000;
            break;
          case 6:
            uStackY_a0 = 1000000;
            break;
          case 7:
            uStackY_a0 = 10000000;
            break;
          case 8:
            uStackY_a0 = 100000000;
            break;
          case 9:
            uStackY_a0 = 1000000000;
            break;
          default:
            cVar5 = '\0';
            goto LAB_001392aa;
          }
          cVar5 = (char)((uVar12 & 0xffffffff) / uStackY_a0);
          uVar12 = (uVar12 & 0xffffffff) % uStackY_a0;
LAB_001392aa:
          lVar10 = (long)local_88;
          local_88 = iVar13;
          rVar7 = fixed_handler::on_digit
                            (&handler,cVar5 + '0',
                             *(long *)(basic_data<void>::grisu_pow10_exponents + lVar10 * 8 + 0xa8)
                             << (bVar9 & 0x3f),((uVar12 & 0xffffffff) << (bVar9 & 0x3f)) + uVar14,1,
                             iVar13,true);
          uVar15 = local_80;
          if (rVar7 != more) goto LAB_00139341;
        } while (0 < local_88);
        do {
          uVar12 = uVar14 * 10;
          error = error * 10;
          uVar14 = uVar12 & uVar16;
          local_88 = local_88 + -1;
          rVar7 = fixed_handler::on_digit
                            (&handler,(char)(uVar12 >> (bVar9 & 0x3f)) + '0',uVar15,uVar14,error,
                             local_88,false);
        } while (rVar7 == more);
      }
LAB_00139341:
      this = local_70;
      if (rVar7 == error) {
        local_88 = local_88 + ~cached_exp10 + handler.size;
        fallback_format<long_double>
                  (value,handler.precision,(bool)((byte)((ulong)specs >> 0x32) & 1),local_70,
                   &local_88);
      }
      else {
        local_88 = local_88 + handler.exp10;
        buffer<char>::try_resize(local_70,(ulong)(uint)handler.size);
      }
      if ((uVar6 >> 0x14 & 1) == 0 && uVar11 != 0x200000000) {
        sVar4 = this->size_;
        iVar13 = local_88;
        do {
          local_88 = iVar13;
          count = sVar4;
          if (count == 0) break;
          sVar4 = count - 1;
          iVar13 = local_88 + 1;
        } while (this->ptr_[count - 1] == '0');
        buffer<char>::try_resize(this,count);
      }
    }
  }
  return local_88;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}